

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O3

complex<double> __thiscall soul::Value::PackedData::getAsComplex64(PackedData *this)

{
  Primitive PVar1;
  undefined8 in_RAX;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  complex<double> cVar2;
  
  PVar1 = (this->type->primitiveType).type;
  if (PVar1 == complex32) {
    if (this->size != 8) {
      throwInternalCompilerError("size == sizeof (Primitive)","getAs",0x15e);
    }
  }
  else if (PVar1 == complex64) {
    cVar2 = getAs<std::complex<double>>(this);
    in_RDX = cVar2._M_value._8_8_;
  }
  else {
    getAsDouble(this);
    in_RDX = extraout_RDX;
  }
  cVar2._M_value._8_8_ = in_RDX;
  cVar2._M_value._0_8_ = in_RAX;
  return (complex<double>)cVar2._M_value;
}

Assistant:

std::complex<double> getAsComplex64() const
    {
        if (type.isComplex64())  return getAs<std::complex<double>>();
        if (type.isComplex32())  return getAs<std::complex<float>>();

        return { getAsDouble(), 0.0 };
    }